

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mid2svg.cpp
# Opt level: O3

void drawLines(ostream *out,MidiFile *midifile,vector<double,_std::allocator<double>_> *hues,
              Options *options)

{
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  MidiEventList *pMVar7;
  long *plVar8;
  ostream *poVar9;
  MidiEvent *this;
  long *plVar10;
  size_type *psVar11;
  int aTrack;
  int j;
  Options *options_00;
  ulong uVar12;
  string color;
  string local_98;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  vector<double,_std::allocator<double>_> *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_58 = hues;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"dash","");
  bVar2 = smf::Options::getBoolean(options,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  uVar4 = smf::MidiFile::size(midifile);
  if (0 < (int)uVar4) {
    uVar12 = (ulong)uVar4;
    do {
      uVar1 = uVar12 - 1;
      aTrack = (int)uVar1;
      pMVar7 = smf::MidiFile::operator[](midifile,aTrack);
      iVar5 = hasNotes(pMVar7);
      if (iVar5 != 0) {
        __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                  (&local_50,vsnprintf,0x148,"%f",
                   SUB84((local_58->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start[uVar1],0));
        options_00 = (Options *)0x4;
        plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x131d98);
        local_78 = &local_68;
        plVar10 = plVar8 + 2;
        if ((long *)*plVar8 == plVar10) {
          local_68 = *plVar10;
          lStack_60 = plVar8[3];
        }
        else {
          local_68 = *plVar10;
          local_78 = (long *)*plVar8;
        }
        local_70 = plVar8[1];
        *plVar8 = (long)plVar10;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_78);
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        psVar11 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_98.field_2._M_allocated_capacity = *psVar11;
          local_98.field_2._8_8_ = plVar8[3];
        }
        else {
          local_98.field_2._M_allocated_capacity = *psVar11;
          local_98._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_98._M_string_length = plVar8[1];
        *plVar8 = (long)psVar11;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        if (local_78 != &local_68) {
          operator_delete(local_78);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        if (bwQ != 0) {
          std::__cxx11::string::_M_assign((string *)&local_98);
        }
        std::__ostream_insert<char,std::char_traits<char>>(out,"\t\t<g",4);
        std::__ostream_insert<char,std::char_traits<char>>(out," class=\"note-lines track-",0x19);
        poVar9 = (ostream *)std::ostream::operator<<((ostream *)out,aTrack);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\"",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9," fill=\"none\" stroke=\"",0x15);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,local_98._M_dataplus._M_p,local_98._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\"",1);
        if (bVar2) {
          std::__ostream_insert<char,std::char_traits<char>>(out," stroke-dasharray=\"",0x13);
          poVar9 = std::ostream::_M_insert<double>(2.25);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\"",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    (out," vector-effect=\"non-scaling-stroke\"",0x23);
        }
        std::__ostream_insert<char,std::char_traits<char>>(out," stroke-width=\"",0xf);
        poVar9 = std::ostream::_M_insert<double>(LineThickness);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\">\n",3);
        iVar5 = 0;
        while( true ) {
          pMVar7 = smf::MidiFile::operator[](midifile,aTrack);
          iVar6 = smf::MidiEventList::size(pMVar7);
          if (iVar6 <= iVar5) break;
          pMVar7 = smf::MidiFile::operator[](midifile,aTrack);
          this = smf::MidiEventList::operator[](pMVar7,iVar5);
          bVar3 = smf::MidiMessage::isNoteOn(&this->super_MidiMessage);
          if (bVar3) {
            printLineToNextNote(out,midifile,aTrack,iVar5,options_00);
          }
          iVar5 = iVar5 + 1;
        }
        std::__ostream_insert<char,std::char_traits<char>>(out,"\t\t</g>\n",7);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p);
        }
      }
      bVar3 = 1 < (long)uVar12;
      uVar12 = uVar1;
    } while (bVar3);
  }
  return;
}

Assistant:

void drawLines(ostream& out, MidiFile& midifile, vector<double>& hues,
      Options& options) {
   int dashing = options.getBoolean("dash");
   int track = 0;
   for (int i=midifile.size()-1; i>=0; i--) {
      if (!hasNotes(midifile[i])) {
         continue;
      }
      track = i;
      string color = "hsl(" + to_string(hues[i]) + ", 100%, 75%)";
      if (bwQ) {
         color = StaffColor;
      }
      out << "\t\t<g"
          << " class=\"note-lines track-" << track << "\""
          << " fill=\"none\" stroke=\"" << color << "\"";

      // double scale = options.getDouble("scale");
      if (dashing) {
         double dwidth = 2.25;
         out << " stroke-dasharray=\"" << dwidth << "\"";
         out << " vector-effect=\"non-scaling-stroke\"";
      }
      out << " stroke-width=\""<< LineThickness << "\">\n";
      for (int j=0; j<midifile[i].size(); j++) {
         if (!midifile[i][j].isNoteOn()) {
            continue;
         }
         printLineToNextNote(out, midifile, i, j, options);
      }
      out << "\t\t</g>\n";
   }
}